

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O3

Error __thiscall
asmjit::BaseBuilder::_newEmbedDataNode
          (BaseBuilder *this,EmbedDataNode **out,uint32_t typeId,void *data,size_t itemCount,
          size_t repeatCount)

{
  byte bVar1;
  uint8_t *puVar2;
  undefined1 auVar3 [16];
  int iVar4;
  Error EVar5;
  ulong size;
  EmbedDataNode *unaff_RBX;
  size_t unaff_RBP;
  anon_union_64_2_7f42e22f_for_EmbedDataNode_3 *paVar6;
  anon_union_64_2_7f42e22f_for_EmbedDataNode_3 *__dest;
  EmbedDataNode *unaff_R13;
  EmbedDataNode **local_50;
  size_t local_48;
  size_t local_38;
  
  *out = (EmbedDataNode *)0x0;
  iVar4 = 0;
  if ((typeId & 0xfffffffe) == 0x20) {
    iVar4 = (uint)(((this->super_BaseEmitter)._environment._arch & 1) == 0) * 2 + 6;
  }
  if (0x44 < (iVar4 + typeId) - 0x20) {
    EVar5 = 2;
LAB_0011214a:
    EVar5 = BaseEmitter::reportError(&this->super_BaseEmitter,EVar5,(char *)0x0);
    return EVar5;
  }
  bVar1 = Type::_typeData[(ulong)(iVar4 + typeId) + 0x100];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = itemCount;
  auVar3 = auVar3 * ZEXT116(bVar1);
  size = auVar3._0_8_;
  if (auVar3._8_8_ != 0) {
    EVar5 = 1;
    goto LAB_0011214a;
  }
  if ((this->_allocator)._zone == (Zone *)0x0) {
    _newEmbedDataNode();
  }
  else {
    unaff_RBX = (EmbedDataNode *)ZoneAllocator::_alloc(&this->_allocator,0x80,&local_38);
    unaff_RBP = itemCount;
    unaff_R13 = unaff_RBX;
    local_50 = out;
    local_48 = repeatCount;
    if (unaff_RBX != (EmbedDataNode *)0x0) {
      (unaff_RBX->super_BaseNode).field_0.field_0._prev = (BaseNode *)0x0;
      (unaff_RBX->super_BaseNode).field_0.field_0._next = (BaseNode *)0x0;
      (unaff_RBX->super_BaseNode).field_1._any._nodeType = '\x05';
      (unaff_RBX->super_BaseNode).field_1._any._nodeFlags = (byte)this->_nodeFlags | 2;
      *(undefined8 *)&(unaff_RBX->super_BaseNode)._position = 0;
      *(undefined8 *)((long)&(unaff_RBX->super_BaseNode).field_3 + 4) = 0;
      (unaff_RBX->super_BaseNode)._passData = (void *)0x0;
      (unaff_RBX->super_BaseNode)._inlineComment = (char *)0x0;
      (unaff_RBX->field_2)._externalData = (uint8_t *)0x0;
      *(undefined8 *)((long)&unaff_RBX->field_2 + 8) = 0;
      *(undefined8 *)((long)&unaff_RBX->field_2 + 0x10) = 0;
      *(undefined8 *)((long)&unaff_RBX->field_2 + 0x18) = 0;
      *(undefined8 *)((long)&unaff_RBX->field_2 + 0x20) = 0;
      *(undefined8 *)((long)&unaff_RBX->field_2 + 0x28) = 0;
      *(undefined8 *)((long)&unaff_RBX->field_2 + 0x30) = 0;
      *(undefined8 *)((long)&unaff_RBX->field_2 + 0x38) = 0;
      goto LAB_0011209a;
    }
  }
  EVar5 = BaseEmitter::reportError(&this->super_BaseEmitter,1,(char *)0x0);
  if (EVar5 != 0) {
    return EVar5;
  }
LAB_0011209a:
  (unaff_R13->super_BaseNode).field_1._any._reserved0 = (uint8_t)typeId;
  (unaff_R13->super_BaseNode).field_1._any._reserved1 = bVar1;
  unaff_R13->_itemCount = unaff_RBP;
  unaff_R13->_repeatCount = local_48;
  __dest = &unaff_RBX->field_2;
  if (0x40 < size) {
    puVar2 = (this->_dataZone)._end;
    paVar6 = (anon_union_64_2_7f42e22f_for_EmbedDataNode_3 *)
             ((ulong)((this->_dataZone)._ptr + 7) & 0xfffffffffffffff8);
    if ((paVar6 < puVar2) && (size <= (ulong)((long)puVar2 - (long)paVar6->_inlineData))) {
      (this->_dataZone)._ptr = paVar6->_inlineData + size;
    }
    else {
      paVar6 = (anon_union_64_2_7f42e22f_for_EmbedDataNode_3 *)Zone::_alloc(&this->_dataZone,size,8)
      ;
    }
    if (paVar6 == (anon_union_64_2_7f42e22f_for_EmbedDataNode_3 *)0x0) {
      EVar5 = BaseEmitter::reportError(&this->super_BaseEmitter,1,(char *)0x0);
      return EVar5;
    }
    __dest->_externalData = (uint8_t *)paVar6;
    __dest = paVar6;
  }
  if (data != (void *)0x0) {
    memcpy(__dest,data,size);
  }
  *local_50 = unaff_R13;
  return 0;
}

Assistant:

Error BaseBuilder::_newEmbedDataNode(EmbedDataNode** out, uint32_t typeId, const void* data, size_t itemCount, size_t repeatCount) {
  *out = nullptr;

  uint32_t deabstractDelta = Type::deabstractDeltaOfSize(registerSize());
  uint32_t finalTypeId = Type::deabstract(typeId, deabstractDelta);

  if (ASMJIT_UNLIKELY(!Type::isValid(finalTypeId)))
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  uint32_t typeSize = Type::sizeOf(finalTypeId);
  Support::FastUInt8 of = 0;

  size_t dataSize = Support::mulOverflow(itemCount, size_t(typeSize), &of);
  if (ASMJIT_UNLIKELY(of))
    return reportError(DebugUtils::errored(kErrorOutOfMemory));

  EmbedDataNode* node;
  ASMJIT_PROPAGATE(_newNodeT<EmbedDataNode>(&node));

  node->_embed._typeId = uint8_t(typeId);
  node->_embed._typeSize = uint8_t(typeSize);
  node->_itemCount = itemCount;
  node->_repeatCount = repeatCount;

  uint8_t* dstData = node->_inlineData;
  if (dataSize > EmbedDataNode::kInlineBufferSize) {
    dstData = static_cast<uint8_t*>(_dataZone.alloc(dataSize, 8));
    if (ASMJIT_UNLIKELY(!dstData))
      return reportError(DebugUtils::errored(kErrorOutOfMemory));
    node->_externalData = dstData;
  }

  if (data)
    memcpy(dstData, data, dataSize);

  *out = node;
  return kErrorOk;
}